

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  element_type *peVar1;
  element_type *peVar2;
  ParseException *e;
  ThrowPacket *packet;
  undefined1 local_d8 [8];
  Interpreter interpreter;
  undefined1 local_b8 [8];
  ptr<Object> module;
  ptr<ObjectExpression> moduleExpression;
  undefined1 local_88 [8];
  Parser parser;
  char *filename;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    this = std::operator<<((ostream *)&std::cout,"Usage: katon <filepath>");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    parser._96_8_ = argv[1];
    Parser::Parser((Parser *)local_88,(char *)parser._96_8_);
    Parser::parse((Parser *)
                  &module.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    peVar1 = std::__shared_ptr_access<ObjectExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ObjectExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&module.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    (**(peVar1->super_Expression)._vptr_Expression)
              (&interpreter.object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,peVar1,0);
    peVar2 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &interpreter.object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    (*(peVar2->super_Member)._vptr_Member[6])(local_b8);
    std::shared_ptr<Value>::~shared_ptr
              ((shared_ptr<Value> *)
               &interpreter.object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<Object>::shared_ptr
              ((shared_ptr<Object> *)&packet,(shared_ptr<Object> *)local_b8);
    Interpreter::Interpreter((Interpreter *)local_d8,(shared_ptr<Object> *)&packet);
    std::shared_ptr<Object>::~shared_ptr((shared_ptr<Object> *)&packet);
    Interpreter::execute((Interpreter *)local_d8,false);
    Interpreter::~Interpreter((Interpreter *)local_d8);
    std::shared_ptr<Object>::~shared_ptr((shared_ptr<Object> *)local_b8);
    std::shared_ptr<ObjectExpression>::~shared_ptr
              ((shared_ptr<ObjectExpression> *)
               &module.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Parser::~Parser((Parser *)local_88);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    if(argc < 2) {
        std::cout << "Usage: katon <filepath>" << std::endl;
        return 0;
    }

    char* filename = argv[1];

    try {
        Parser parser(filename);
        ptr<ObjectExpression> moduleExpression = parser.parse();
        ptr<Object> module = moduleExpression -> evaluate(nullptr) -> asObject();

        Interpreter interpreter(module);
        interpreter.execute();

    } catch(ParseException& e) {
        std::cout << e.what() << std::endl;
    } catch(ThrowPacket& packet) {
        std::cout << "Error: " << packet.getValue() -> asString() << std::endl;
    }

    return 0;
}